

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O2

void QSslSocketPrivate::setDefaultSupportedEllipticCurves(QList<QSslEllipticCurve> *curves)

{
  Type *pTVar1;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_> *pQVar2;
  long in_FS_OFFSET;
  undefined1 local_28 [16];
  long local_18;
  
  pQVar2 = (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_> *)
           local_28;
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  pTVar1 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_>::
           operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_>
                       *)curves);
  QMutexLocker<QMutex>::QMutexLocker((QMutexLocker<QMutex> *)local_28,&pTVar1->mutex);
  pTVar1 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_>::
           operator()(pQVar2);
  pQVar2 = (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_> *)
           &pTVar1->config;
  QExplicitlySharedDataPointer<QSslConfigurationPrivate>::detach
            ((QExplicitlySharedDataPointer<QSslConfigurationPrivate> *)pQVar2);
  pTVar1 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_>::
           operator()(pQVar2);
  pQVar2 = (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_> *)
           &pTVar1->dtlsConfig;
  QExplicitlySharedDataPointer<QSslConfigurationPrivate>::detach
            ((QExplicitlySharedDataPointer<QSslConfigurationPrivate> *)pQVar2);
  pTVar1 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_>::
           operator()(pQVar2);
  QArrayDataPointer<QSslEllipticCurve>::operator=(&(pTVar1->supportedEllipticCurves).d,&curves->d);
  QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSslSocketPrivate::setDefaultSupportedEllipticCurves(const QList<QSslEllipticCurve> &curves)
{
    const QMutexLocker locker(&globalData()->mutex);
    globalData()->config.detach();
    globalData()->dtlsConfig.detach();
    globalData()->supportedEllipticCurves = curves;
}